

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::ParallelWorkFunc<1u>(Recycler *this)

{
  CollectionState CVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  CVar1 = (this->collectionState).value;
  if ((CVar1 != CollectionStateBackgroundParallelMark) && (CVar1 != CollectionStateParallelMark)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1b23,"(false)","false");
    if (bVar3) {
      *puVar4 = 0;
      return;
    }
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  if (this->enableScanInteriorPointers == true) {
    ProcessMarkContext<true,true>(this,&this->parallelMarkContext3);
    return;
  }
  ProcessMarkContext<true,false>(this,&this->parallelMarkContext3);
  return;
}

Assistant:

void
Recycler::ParallelWorkFunc()
{
    Assert(parallelId == 0 || parallelId == 1);

    MarkContext * markContext = (parallelId == 0 ? &this->parallelMarkContext2 : &this->parallelMarkContext3);

    switch (this->collectionState)
    {
        case CollectionStateParallelMark:
            this->ProcessParallelMark(false, markContext);
            break;

        case CollectionStateBackgroundParallelMark:
            this->ProcessParallelMark(true, markContext);
            break;

        default:
            Assert(false);
    }
}